

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_paste_callback(void *vterm)

{
  strbuf *buf_o;
  int iVar1;
  wchar_t wVar2;
  strbuf *buf;
  wchar_t n;
  Terminal *term;
  void *vterm_local;
  
  if (*(int *)((long)vterm + 0x10d8) != 0) {
    do {
      if (*(int *)((long)vterm + 0x10d8) <= *(int *)((long)vterm + 0x10dc)) {
        term_bracketed_paste_stop((Terminal *)vterm);
        safefree(*(void **)((long)vterm + 0x10d0));
        *(undefined8 *)((long)vterm + 0x10d0) = 0;
        *(undefined4 *)((long)vterm + 0x10d8) = 0;
        return;
      }
      buf._4_4_ = L'\0';
      do {
        if (*(int *)((long)vterm + 0x10d8) <= buf._4_4_ + *(int *)((long)vterm + 0x10dc)) break;
        wVar2 = buf._4_4_ + L'\x01';
        iVar1 = *(int *)((long)vterm + 0x10dc) + buf._4_4_;
        buf._4_4_ = wVar2;
      } while (*(int *)(*(long *)((long)vterm + 0x10d0) + (long)iVar1 * 4) != 0xd);
      if (*(long *)((long)vterm + 0x10e8) != 0) {
        buf_o = term_input_data_from_unicode
                          ((Terminal *)vterm,
                           (wchar_t *)
                           (*(long *)((long)vterm + 0x10d0) +
                           (long)*(int *)((long)vterm + 0x10dc) * 4),buf._4_4_);
        term_keyinput_internal((Terminal *)vterm,buf_o->s,(wchar_t)buf_o->len,false);
        strbuf_free(buf_o);
      }
      *(wchar_t *)((long)vterm + 0x10dc) = buf._4_4_ + *(int *)((long)vterm + 0x10dc);
    } while (*(int *)((long)vterm + 0x10d8) <= *(int *)((long)vterm + 0x10dc));
    queue_toplevel_callback(term_paste_callback,vterm);
  }
  return;
}

Assistant:

static void term_paste_callback(void *vterm)
{
    Terminal *term = (Terminal *)vterm;

    if (term->paste_len == 0)
        return;

    while (term->paste_pos < term->paste_len) {
        int n = 0;
        while (n + term->paste_pos < term->paste_len) {
            if (term->paste_buffer[term->paste_pos + n++] == '\015')
                break;
        }
        if (term->ldisc) {
            strbuf *buf = term_input_data_from_unicode(
                term, term->paste_buffer + term->paste_pos, n);
            term_keyinput_internal(term, buf->s, buf->len, false);
            strbuf_free(buf);
        }
        term->paste_pos += n;

        if (term->paste_pos < term->paste_len) {
            queue_toplevel_callback(term_paste_callback, term);
            return;
        }
    }
    term_bracketed_paste_stop(term);
    sfree(term->paste_buffer);
    term->paste_buffer = NULL;
    term->paste_len = 0;
}